

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadPointLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  LightNodeImpl<embree::SceneGraph::PointLight> *this_00;
  undefined8 *in_RDX;
  XMLLoader *this_01;
  string *childID;
  AffineSpace3fa space;
  allocator local_d1;
  undefined1 local_d0 [12];
  float fStack_c4;
  float fStack_c0;
  undefined4 uStack_bc;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  pointer pcStack_b0;
  undefined1 local_a8 [16];
  PointLight local_98;
  undefined4 local_68;
  undefined4 uStack_64;
  _Base_ptr p_Stack_60;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  this_01 = (XMLLoader *)*in_RDX;
  std::__cxx11::string::string((string *)&local_98,"AffineSpace",(allocator *)local_d0);
  XML::child((XML *)(local_d0 + 8),(string *)this_01);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            ((AffineSpace3fa *)&local_58.field_1,this_01,(Ref<embree::XML> *)(local_d0 + 8));
  if ((long *)CONCAT44(fStack_c4,local_d0._8_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(fStack_c4,local_d0._8_4_) + 0x18))();
  }
  std::__cxx11::string::~string((string *)&local_98);
  childID = (string *)*in_RDX;
  std::__cxx11::string::string((string *)&local_98,"I",&local_d1);
  XML::child((XML *)local_d0,childID);
  load<embree::Vec3<float>>((XMLLoader *)(local_d0 + 8),(Ref<embree::XML> *)childID);
  local_68 = fStack_c4;
  uStack_64 = fStack_c0;
  local_a8 = ZEXT416((uint)local_d0._8_4_);
  if ((_func_int **)local_d0._0_8_ != (_func_int **)0x0) {
    p_Stack_60 = (_Base_ptr)0x0;
    (**(code **)(*(_func_int **)local_d0._0_8_ + 0x18))();
    fStack_c4 = (float)local_68;
    fStack_c0 = (float)uStack_64;
  }
  local_a8._4_4_ = fStack_c4;
  local_a8._8_4_ = fStack_c0;
  std::__cxx11::string::~string((string *)&local_98);
  local_d0._8_4_ = 0;
  fStack_c4 = 0.0;
  fStack_c0 = 0.0;
  uStack_bc = 0;
  local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
  pcStack_b0 = (pointer)local_a8._8_8_;
  this_00 = (LightNodeImpl<embree::SceneGraph::PointLight> *)
            SceneGraph::LightNodeImpl<embree::SceneGraph::PointLight>::operator_new(0xa0);
  local_98.P.field_0.m128[0] =
       local_58.m128[0] * 0.0 + fStack_c4 * local_48 + fStack_c0 * local_38 + local_28;
  local_98.P.field_0.m128[1] =
       local_58.m128[1] * 0.0 + fStack_c4 * fStack_44 + fStack_c0 * fStack_34 + fStack_24;
  local_98.P.field_0.m128[2] =
       local_58.m128[2] * 0.0 + fStack_c4 * fStack_40 + fStack_c0 * fStack_30 + fStack_20;
  local_98.P.field_0.m128[3] =
       local_58.m128[3] * 0.0 + fStack_c4 * fStack_3c + fStack_c0 * fStack_2c + fStack_1c;
  local_98.super_Light.type = LIGHT_POINT;
  local_98.I.field_0._0_8_ = local_a8._0_8_;
  local_98.I.field_0._8_8_ = local_a8._8_8_;
  SceneGraph::LightNodeImpl<embree::SceneGraph::PointLight>::LightNodeImpl(this_00,&local_98);
  (this->path).filename._M_dataplus._M_p = (pointer)this_00;
  (**(code **)(*(long *)&(this_00->super_LightNode).super_Node.super_RefCount + 0x10))(this_00);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadPointLight(const Ref<XML>& xml) 
  {
    const AffineSpace3fa space = load<AffineSpace3fa>(xml->child("AffineSpace"));
    const Vec3fa I = load<Vec3f>(xml->child("I"));
    const Vec3fa P = Vec3fa(zero);
    const SceneGraph::PointLight light = SceneGraph::PointLight(P,I);
    return new SceneGraph::LightNodeImpl<SceneGraph::PointLight>(light.transform(space));
  }